

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void cconv_err_conv(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  GCstr *pGVar1;
  int local_3c;
  GCstr *local_38;
  char *src;
  char *dst;
  CTInfo flags_local;
  CType *s_local;
  CType *d_local;
  CTState *cts_local;
  
  pGVar1 = lj_ctype_repr(cts->L,(CTypeID)(((long)d - (long)cts->tab) / 0x18),(GCstr *)0x0);
  if ((flags & 2) == 0) {
    local_38 = lj_ctype_repr(cts->L,(CTypeID)(((long)s - (long)cts->tab) / 0x18),(GCstr *)0x0);
    local_38 = local_38 + 1;
  }
  else {
    if (s->info >> 0x1c == 0) {
      local_3c = 3;
    }
    else {
      local_3c = 0;
      if (s->info >> 0x1c == 3) {
        local_3c = 4;
      }
    }
    local_38 = (GCstr *)lj_obj_typename[local_3c + 1];
  }
  if (flags >> 8 == 0) {
    lj_err_callerv(cts->L,LJ_ERR_FFI_BADCONV,local_38,pGVar1 + 1);
  }
  lj_err_argv(cts->L,flags >> 8,LJ_ERR_FFI_BADCONV,local_38,pGVar1 + 1);
}

Assistant:

LJ_NORET static void cconv_err_conv(CTState *cts, CType *d, CType *s,
				    CTInfo flags)
{
  const char *dst = strdata(lj_ctype_repr(cts->L, ctype_typeid(cts, d), NULL));
  const char *src;
  if ((flags & CCF_FROMTV))
    src = lj_obj_typename[1+(ctype_isnum(s->info) ? LUA_TNUMBER :
			     ctype_isarray(s->info) ? LUA_TSTRING : LUA_TNIL)];
  else
    src = strdata(lj_ctype_repr(cts->L, ctype_typeid(cts, s), NULL));
  if (CCF_GETARG(flags))
    lj_err_argv(cts->L, CCF_GETARG(flags), LJ_ERR_FFI_BADCONV, src, dst);
  else
    lj_err_callerv(cts->L, LJ_ERR_FFI_BADCONV, src, dst);
}